

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O3

QVariant * __thiscall
QMimeDataPrivate::retrieveTypedData
          (QVariant *__return_storage_ptr__,QMimeDataPrivate *this,QString *format,QMetaType type)

{
  QObject *pQVar1;
  QByteArrayView text;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  QMetaType QVar7;
  char *pcVar8;
  qsizetype objectSize;
  QMetaTypeInterface *data;
  long lVar9;
  QVariant *pQVar10;
  long in_FS_OFFSET;
  QByteArrayView data_00;
  QLatin1StringView rhs;
  QByteArrayView data_01;
  QLatin1StringView rhs_00;
  QLatin1StringView rhs_01;
  QByteArrayView in;
  QByteArrayView ba;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringDecoder decoder;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  QMetaType in_stack_ffffffffffffff18;
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  QMetaType local_c0;
  undefined1 local_b8 [24];
  QMetaType local_a0;
  undefined1 local_98 [24];
  undefined1 *puStack_80;
  anon_union_16_2_cfafc8b3_for_State_4 local_78;
  ClearDataFn local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  local_a0.d_ptr = type.d_ptr;
  if (type.d_ptr == (QMetaTypeInterface *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = ((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar3 == 0) {
      iVar3 = QMetaType::registerHelper(type.d_ptr);
    }
  }
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  (*pQVar1->_vptr_QObject[0xe])(&local_58,pQVar1,format,type.d_ptr);
  if ((((format->d).size == 10) &&
      (rhs.m_data = "text/plain", rhs.m_size = 10, lhs.m_data = (format->d).ptr, lhs.m_size = 10,
      bVar2 = QtPrivate::equalStrings(lhs,rhs), bVar2)) && (puStack_40 < (undefined1 *)0x4)) {
    local_b8._0_8_ = (QMetaTypeInterface *)0x0;
    local_b8._8_8_ = L"text/uri-list";
    local_b8._16_8_ = (QString *)0xd;
    QMetaType::QMetaType(&local_c0,9);
    retrieveTypedData((QVariant *)local_98,this,(QString *)local_b8,local_c0);
    ::QVariant::operator=((QVariant *)&local_58,(QVariant *)local_98);
    ::QVariant::~QVariant((QVariant *)local_98);
    if ((QMetaTypeInterface *)local_b8._0_8_ != (QMetaTypeInterface *)0x0) {
      LOCK();
      (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
    QVar7 = ::QVariant::metaType((QVariant *)&local_58);
    if (QVar7.d_ptr != (QMetaTypeInterface *)0x0) {
      iVar4 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if (iVar4 == 0) {
        iVar4 = QMetaType::registerHelper(QVar7.d_ptr);
      }
      if (iVar4 == 0x11) {
        ::QVariant::toUrl((QVariant *)(local_e0 + 8));
        QUrl::toDisplayString((QString *)local_b8,(QUrl *)(local_e0 + 8),(FormattingOptions)0x0);
        ::QVariant::QVariant((QVariant *)local_98,(QString *)local_b8);
        ::QVariant::operator=((QVariant *)&local_58,(QVariant *)local_98);
        ::QVariant::~QVariant((QVariant *)local_98);
        if ((QMetaTypeInterface *)local_b8._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i =
               (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
        QUrl::~QUrl((QUrl *)(local_e0 + 8));
        goto LAB_002aba8a;
      }
    }
    QVar7 = ::QVariant::metaType((QVariant *)&local_58);
    if (QVar7.d_ptr != (QMetaTypeInterface *)0x0) {
      iVar4 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if (iVar4 == 0) {
        iVar4 = QMetaType::registerHelper(QVar7.d_ptr);
      }
      if (iVar4 == 9) {
        local_b8._0_8_ = (QMetaTypeInterface *)0x0;
        local_b8._8_8_ = (QVariant *)0x0;
        local_b8._16_8_ = (QString *)0x0;
        local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toList((QVariantList *)(local_e0 + 8),(QVariant *)&local_58);
        if ((undefined1 *)local_d8._16_8_ != (undefined1 *)0x0) {
          lVar9 = local_d8._16_8_ << 5;
          iVar4 = 0;
          pQVar10 = (QVariant *)local_d8._8_8_;
          do {
            QVar7 = ::QVariant::metaType(pQVar10);
            if (QVar7.d_ptr != (QMetaTypeInterface *)0x0) {
              iVar5 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
              if (iVar5 == 0) {
                iVar5 = QMetaType::registerHelper(QVar7.d_ptr);
              }
              if (iVar5 == 0x11) {
                ::QVariant::toUrl((QVariant *)local_e0);
                QUrl::toDisplayString((QString *)local_98,(QUrl *)local_e0,(FormattingOptions)0x0);
                QString::append((QString *)local_b8,(QString *)local_98);
                if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
                  }
                }
                QUrl::~QUrl((QUrl *)local_e0);
                QString::append((QString *)local_b8,(QChar)0xa);
                iVar4 = iVar4 + 1;
              }
            }
            pQVar10 = pQVar10 + 1;
            lVar9 = lVar9 + -0x20;
          } while (lVar9 != 0);
          in_stack_ffffffffffffff14 = iVar3;
          if (iVar4 == 1) {
            QString::chop((QString *)local_b8,1);
          }
        }
        ::QVariant::QVariant((QVariant *)local_98,(QString *)local_b8);
        ::QVariant::operator=((QVariant *)&local_58,(QVariant *)local_98);
        ::QVariant::~QVariant((QVariant *)local_98);
        QArrayDataPointer<QVariant>::~QArrayDataPointer
                  ((QArrayDataPointer<QVariant> *)(local_e0 + 8));
        if ((QMetaTypeInterface *)local_b8._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i =
               (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
      }
    }
  }
LAB_002aba8a:
  local_98._0_8_ = ::QVariant::metaType((QVariant *)&local_58);
  bVar2 = ::comparesEqual((QMetaType *)local_98,&local_a0);
  if ((bVar2) || (puStack_40 < (undefined1 *)0x4)) goto switchD_002abc99_caseD_b;
  if (iVar3 < 0x1001) {
    if (iVar3 == 9) {
      QVar7 = ::QVariant::metaType((QVariant *)&local_58);
      if (QVar7.d_ptr != (QMetaTypeInterface *)0x0) {
        iVar4 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar4 == 0) {
          iVar4 = QMetaType::registerHelper(QVar7.d_ptr);
        }
        if (iVar4 == 0x11) goto switchD_002abc99_caseD_b;
      }
    }
    else if ((iVar3 == 0x11) &&
            (QVar7 = ::QVariant::metaType((QVariant *)&local_58),
            QVar7.d_ptr != (QMetaTypeInterface *)0x0)) {
      iVar4 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if (iVar4 == 0) {
        iVar4 = QMetaType::registerHelper(QVar7.d_ptr);
      }
      if (iVar4 == 9) goto switchD_002abc99_caseD_b;
    }
  }
  else if (iVar3 == 0x1001) {
    QVar7 = ::QVariant::metaType((QVariant *)&local_58);
    if (QVar7.d_ptr != (QMetaTypeInterface *)0x0) {
      iVar4 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if (iVar4 == 0) {
        iVar4 = QMetaType::registerHelper(QVar7.d_ptr);
      }
      if (iVar4 == 0x1006) goto switchD_002abc99_caseD_b;
    }
  }
  else if ((iVar3 == 0x1006) &&
          (QVar7 = ::QVariant::metaType((QVariant *)&local_58),
          QVar7.d_ptr != (QMetaTypeInterface *)0x0)) {
    iVar4 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar4 == 0) {
      iVar4 = QMetaType::registerHelper(QVar7.d_ptr);
    }
    if (iVar4 == 0x1001) goto switchD_002abc99_caseD_b;
  }
  QVar7 = ::QVariant::metaType((QVariant *)&local_58);
  if (QVar7.d_ptr == (QMetaTypeInterface *)0x0) {
LAB_002abc51:
    if ((iVar3 == 0xc) &&
       (QVar7 = ::QVariant::metaType((QVariant *)&local_58),
       QVar7.d_ptr != (QMetaTypeInterface *)0x0)) {
      iVar3 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if (iVar3 == 0) {
        iVar3 = QMetaType::registerHelper(QVar7.d_ptr);
      }
      switch(iVar3) {
      case 9:
        local_98._0_8_ = (QMetaTypeInterface *)0x0;
        local_98._8_8_ = (undefined1 *)0x0;
        local_98._16_8_ = (undefined1 *)0x0;
        local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toList((QVariantList *)local_b8,(QVariant *)&local_58);
        if ((QString *)local_b8._16_8_ != (QString *)0x0) {
          lVar9 = local_b8._16_8_ << 5;
          pQVar10 = (QVariant *)local_b8._8_8_;
          do {
            QVar7 = ::QVariant::metaType(pQVar10);
            if (QVar7.d_ptr != (QMetaTypeInterface *)0x0) {
              iVar3 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
              if (iVar3 == 0) {
                iVar3 = QMetaType::registerHelper(QVar7.d_ptr);
              }
              if (iVar3 == 0x11) {
                ::QVariant::toUrl((QVariant *)local_e0);
                QUrl::toEncoded((QByteArray *)(local_e0 + 8),(QUrl *)local_e0,
                                (FormattingOptions)0x1f00000);
                QByteArray::append((QByteArray *)local_98,(QByteArray *)(local_e0 + 8));
                if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
                  }
                }
                QUrl::~QUrl((QUrl *)local_e0);
                data_01.m_data = "\r\n";
                data_01.m_size = 2;
                QByteArray::insert((QByteArray *)local_98,local_98._16_8_,data_01);
              }
            }
            pQVar10 = pQVar10 + 1;
            lVar9 = lVar9 + -0x20;
          } while (lVar9 != 0);
        }
        if ((undefined1 *)local_98._16_8_ != (undefined1 *)0x0) {
          ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)local_98);
          QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_b8);
          goto LAB_002abe98;
        }
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_b8);
        if ((QMetaTypeInterface *)local_98._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i =
               (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
          }
        }
        break;
      case 10:
        ::QVariant::toString((QString *)local_b8,(QVariant *)&local_58);
        QString::toUtf8_helper((QByteArray *)local_98,(QString *)local_b8);
        ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)local_98);
        if ((QMetaTypeInterface *)local_98._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i =
               (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
          }
        }
        if ((QMetaTypeInterface *)local_b8._0_8_ == (QMetaTypeInterface *)0x0) goto LAB_002ac0e9;
        LOCK();
        (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 0)
        goto LAB_002ac0e9;
        objectSize = 2;
        data = (QMetaTypeInterface *)local_b8._0_8_;
        goto LAB_002ac194;
      case 0xb:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
        break;
      case 0xc:
switchD_002abc99_caseD_c:
        ::QVariant::toByteArray((QByteArray *)local_98,(QVariant *)&local_58);
        ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)local_98);
LAB_002abe98:
        if ((QMetaTypeInterface *)local_98._0_8_ == (QMetaTypeInterface *)0x0) goto LAB_002ac0e9;
        LOCK();
        (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        iVar3 = (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        data = (QMetaTypeInterface *)local_98._0_8_;
        goto joined_r0x002abea7;
      case 0x11:
        ::QVariant::toUrl((QVariant *)local_b8);
        QUrl::toEncoded((QByteArray *)local_98,(QUrl *)local_b8,(FormattingOptions)0x1f00000);
        ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)local_98);
        if ((QMetaTypeInterface *)local_98._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i =
               (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
          }
        }
        QUrl::~QUrl((QUrl *)local_b8);
        goto LAB_002ac0e9;
      default:
        if (iVar3 == 0x1003) goto switchD_002abc99_caseD_c;
      }
    }
switchD_002abc99_caseD_b:
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
    *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = puStack_40;
    (__return_storage_ptr__->d).data.shared = local_58.shared;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x2;
  }
  else {
    uVar6 = ((QVar7.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (uVar6 == 0) {
      uVar6 = QMetaType::registerHelper(QVar7.d_ptr);
    }
    pcVar8 = (char *)(ulong)uVar6;
    if (uVar6 != 0xc) goto LAB_002abc51;
    if (0x10 < iVar3) {
      if (iVar3 == 0x11) {
LAB_002abe46:
        ::QVariant::view<QByteArrayView>((QVariant *)&local_58);
        text.m_size._4_4_ = in_stack_ffffffffffffff14;
        text.m_size._0_4_ = in_stack_ffffffffffffff10;
        text.m_data = (storage_type *)in_stack_ffffffffffffff18.d_ptr;
        dataToUrls(text);
        ::QVariant::QVariant(__return_storage_ptr__,(QList<QVariant> *)local_98);
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_98);
        goto LAB_002ac0e9;
      }
      if (iVar3 == 0x1003) {
        *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)&local_58);
        QMetaType::QMetaType((QMetaType *)&stack0xffffffffffffff18,0x1003);
        ::QVariant::convert(__return_storage_ptr__,in_stack_ffffffffffffff18);
        goto LAB_002ac0e9;
      }
      goto switchD_002abc99_caseD_b;
    }
    if (iVar3 == 9) {
      if (((format->d).size == 0xd) &&
         (rhs_00.m_data = "text/uri-list", rhs_00.m_size = 0xd, lhs_00.m_data = (format->d).ptr,
         lhs_00.m_size = 0xd, bVar2 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar2))
      goto LAB_002abe46;
      goto switchD_002abc99_caseD_b;
    }
    if (iVar3 != 10) goto switchD_002abc99_caseD_b;
    local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toByteArray((QByteArray *)local_b8,(QVariant *)&local_58);
    bVar2 = QByteArray::isNull((QByteArray *)local_b8);
    if (bVar2) {
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    }
    else {
      if ((format->d).size == 9) {
        rhs_01.m_data = "text/html";
        rhs_01.m_size = 9;
        pcVar8 = "text/html";
        lhs_01.m_data = (format->d).ptr;
        lhs_01.m_size = 9;
        bVar2 = QtPrivate::equalStrings(lhs_01,rhs_01);
        if (bVar2) {
          local_68 = (ClearDataFn)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d[0] = &DAT_aaaaaaaaaaaaaaaa;
          local_78.d[1] = &DAT_aaaaaaaaaaaaaaaa;
          local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          data_00.m_data = (storage_type *)local_b8._8_8_;
          data_00.m_size = local_b8._16_8_;
          QStringDecoder::decoderForHtml((QStringDecoder *)local_98,data_00);
          if ((QMetaTypeInterface *)local_98._0_8_ != (QMetaTypeInterface *)0x0) {
            in.m_data = (storage_type *)local_b8._8_8_;
            in.m_size = local_b8._16_8_;
            QStringDecoder::decodeAsString((QString *)(local_e0 + 8),(QStringDecoder *)local_98,in);
            ::QVariant::QVariant(__return_storage_ptr__,(QString *)(local_e0 + 8));
            if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
              }
            }
            QStringConverterBase::State::clear((State *)(local_98 + 8));
            goto LAB_002ac173;
          }
          QStringConverterBase::State::clear((State *)(local_98 + 8));
        }
      }
      ba.m_data = pcVar8;
      ba.m_size = local_b8._8_8_;
      QString::fromUtf8((QString *)local_98,(QString *)local_b8._16_8_,ba);
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_98);
      if ((QMetaTypeInterface *)local_98._0_8_ != (QMetaTypeInterface *)0x0) {
        LOCK();
        (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QAtomicInt *)local_98._0_8_)->super_QAtomicInteger<int>).
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
        }
      }
    }
LAB_002ac173:
    if ((QMetaTypeInterface *)local_b8._0_8_ == (QMetaTypeInterface *)0x0) goto LAB_002ac0e9;
    LOCK();
    (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    iVar3 = (((QAtomicInt *)local_b8._0_8_)->super_QAtomicInteger<int>).
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    data = (QMetaTypeInterface *)local_b8._0_8_;
joined_r0x002abea7:
    if (iVar3 != 0) goto LAB_002ac0e9;
    objectSize = 1;
LAB_002ac194:
    QArrayData::deallocate((QArrayData *)data,objectSize,0x10);
  }
LAB_002ac0e9:
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QMimeDataPrivate::retrieveTypedData(const QString &format, QMetaType type) const
{
    Q_Q(const QMimeData);
    int typeId = type.id();

    QVariant data = q->retrieveData(format, type);

    // Text data requested: fallback to URL data if available
    if (format == "text/plain"_L1 && !data.isValid()) {
        data = retrieveTypedData(textUriListLiteral(), QMetaType(QMetaType::QVariantList));
        if (data.metaType().id() == QMetaType::QUrl) {
            data = QVariant(data.toUrl().toDisplayString());
        } else if (data.metaType().id() == QMetaType::QVariantList) {
            QString text;
            int numUrls = 0;
            const QList<QVariant> list = data.toList();
            for (const auto &element : list) {
                if (element.metaType().id() == QMetaType::QUrl) {
                    text += element.toUrl().toDisplayString();
                    text += u'\n';
                    ++numUrls;
                }
            }
            if (numUrls == 1)
                text.chop(1); // no final '\n' if there's only one URL
            data = QVariant(text);
        }
    }

    if (data.metaType() == type || !data.isValid())
        return data;

    // provide more conversion possibilities than just what QVariant provides

    // URLs can be lists as well...
    if ((typeId == QMetaType::QUrl && data.metaType().id() == QMetaType::QVariantList)
        || (typeId == QMetaType::QVariantList && data.metaType().id() == QMetaType::QUrl))
        return data;

    // images and pixmaps are interchangeable
    if ((typeId == QMetaType::QPixmap && data.metaType().id() == QMetaType::QImage)
        || (typeId == QMetaType::QImage && data.metaType().id() == QMetaType::QPixmap))
        return data;

    if (data.metaType().id() == QMetaType::QByteArray) {
        // see if we can convert to the requested type
        switch (typeId) {
        case QMetaType::QString: {
            const QByteArray ba = data.toByteArray();
            if (ba.isNull())
                return QVariant();
            if (format == "text/html"_L1) {
                QStringDecoder decoder = QStringDecoder::decoderForHtml(ba);
                if (decoder.isValid()) {
                    return QString(decoder(ba));
                }
                // fall back to utf8
            }
            return QString::fromUtf8(ba);
        }
        case QMetaType::QColor: {
            QVariant newData = data;
            newData.convert(QMetaType(QMetaType::QColor));
            return newData;
        }
        case QMetaType::QVariantList: {
            if (format != "text/uri-list"_L1)
                break;
            Q_FALLTHROUGH();
        }
        case QMetaType::QUrl: {
            auto bav = data.view<QByteArrayView>();
            // Qt 3.x will send text/uri-list with a trailing
            // null-terminator (that is *not* sent for any other
            // text/* mime-type), so chop it off
            if (bav.endsWith('\0'))
                bav.chop(1);
            return dataToUrls(bav);
        }
        default:
            break;
        }

    } else if (typeId == QMetaType::QByteArray) {

        // try to convert to bytearray
        switch (data.metaType().id()) {
        case QMetaType::QByteArray:
        case QMetaType::QColor:
            return data.toByteArray();
        case QMetaType::QString:
            return data.toString().toUtf8();
        case QMetaType::QUrl:
            return data.toUrl().toEncoded();
        case QMetaType::QVariantList: {
            // has to be list of URLs
            QByteArray result;
            const QList<QVariant> list = data.toList();
            for (const auto &element : list) {
                if (element.metaType().id() == QMetaType::QUrl) {
                    result += element.toUrl().toEncoded();
                    result += "\r\n";
                }
            }
            if (!result.isEmpty())
                return result;
            break;
        }
        default:
            break;
        }
    }
    return data;
}